

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O3

SerializedData * __thiscall
Diligent::DeviceObjectArchive::GetSerializedShader
          (DeviceObjectArchive *this,DeviceType Type,size_t Idx)

{
  pointer pSVar1;
  SerializedData *local_10;
  
  pSVar1 = (this->m_DeviceShaders)._M_elems[Type].
           super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (Idx < (ulong)((long)(this->m_DeviceShaders)._M_elems[Type].
                          super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5)) {
    return pSVar1 + Idx;
  }
  if (GetSerializedShader(Diligent::DeviceObjectArchive::DeviceType,unsigned_long)::NullData != '\0'
     ) {
    return &GetSerializedShader::NullData;
  }
  GetSerializedShader();
  return local_10;
}

Assistant:

const auto& GetSerializedShader(DeviceType Type, size_t Idx) const noexcept
    {
        const auto& DeviceShaders = m_DeviceShaders[static_cast<size_t>(Type)];
        if (Idx < DeviceShaders.size())
            return DeviceShaders[Idx];

        static const SerializedData NullData;
        return NullData;
    }